

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_depspawn_sync.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  char *pcVar2;
  bool test_ok;
  Observer __depspawn_temporary92;
  
  x = 0;
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::Observer::Observer(&__depspawn_temporary92,true);
  depspawn::spawn<void(int&),int&>(g,&x);
  depspawn::spawn<void(int&),int&>(g,&x);
  depspawn::spawn<void(int&),int&>(f,&x);
  depspawn::Observer::~Observer(&__depspawn_temporary92);
  poVar1 = std::operator<<((ostream *)&std::cout,"x = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  std::endl<char,std::char_traits<char>>(poVar1);
  test_ok = x == 0xc;
  depspawn::Observer::Observer(&__depspawn_temporary92,true);
  depspawn::spawn<void(int&,bool&),int&,bool&>(h,&x,&test_ok);
  depspawn::Observer::~Observer(&__depspawn_temporary92);
  poVar1 = std::operator<<((ostream *)&std::cout,"TEST ");
  pcVar2 = "UNSUCCESSFUL";
  if (test_ok != false) {
    pcVar2 = "SUCCESSFUL";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return test_ok ^ 1;
}

Assistant:

int main()
{ 
  x = 0;
  
  std::cout << CLOCKS_PER_SEC << std::endl;

  t0 = std::chrono::high_resolution_clock::now();
  
  depspawn_sync(
    spawn(g, x); //Sets x to 1
    spawn(g, x); //Sets x to 2
    spawn(f, x); //Sets x to 12
  )

  std::cout << "x = " << x << std::endl;

  bool test_ok = (x == 12);

  depspawn_sync(
    spawn(h, x, test_ok);
  )
  
  std::cout << "TEST " << (test_ok ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !test_ok;
}